

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ships.cpp
# Opt level: O2

void verify_horizontal_left(Board *board,int row,int col,Ship *ship)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  
  lVar3 = (long)ship->length + -1;
  if ((int)lVar3 <= col) {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((col - lVar3) * 0x20 +
                            *(long *)&(board->matrix).
                                      super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start[row].
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data),"~");
    if (bVar1) {
      iVar2 = ship->length;
      if (iVar2 <= col) {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )((long)(col - iVar2) * 0x20 +
                                 *(long *)&(board->matrix).
                                           super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start[row].
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data),"~");
        if (bVar1) {
          ship->sRow = row;
          ship->sCol = col;
          goto LAB_00102975;
        }
        iVar2 = ship->length;
      }
      ship->sRow = row;
      ship->sCol = col;
      if (col < iVar2) {
LAB_00102975:
        ship->orientation = 'H';
        ship->direction = -1;
        return;
      }
      goto LAB_0010294e;
    }
  }
  ship->sRow = row;
  ship->sCol = col;
LAB_0010294e:
  ship->orientation = 'N';
  ship->direction = 0;
  return;
}

Assistant:

void verify_horizontal_left( Board *board, int row, int col, Ship *ship )
{
	/*! Checks if the current position plus the rest of the ship exceeds
	 *  the inferior border or touches another ship
	 */
    if( ( col - ( ship->length - 1 ) >= 0) and ( board->matrix[row][col - ( ship->length - 1 )] == "~" ) )
	{
        if( ( col - ship->length >= 0 ) and ( board->matrix[row][col - ship->length] == "~" ) )
        {
            ship->set_values( row, col, 'H', -1 );
        }
        else if( col - ship->length < 0 )
        {
            ship->set_values( row, col, 'H', -1 );
        }
        else
        {
            ship->set_values( row, col, 'N', 0 );
        }
    }
    else
    {
        ship->set_values( row, col, 'N', 0 );
    }
}